

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::TopLevelASVkImpl::TopLevelASVkImpl
          (TopLevelASVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,TopLevelASDesc *Desc)

{
  VulkanMemoryAllocation *rhs;
  bool bVar1;
  VulkanLogicalDevice *this_00;
  VulkanPhysicalDevice *this_01;
  GraphicsAdapterInfo *pGVar2;
  Char *pCVar3;
  VkBuffer_T *pVVar4;
  type tVar5;
  VkAccelerationStructureKHR_T *AS;
  VkDeviceAddress VVar6;
  char (*in_stack_fffffffffffffc58) [3];
  AccelStructWrapper local_2b0;
  undefined1 auStack_298 [8];
  VkAccelerationStructureCreateInfoKHR vkAccelStrCI;
  char *local_250;
  VkResult local_244;
  VkDeviceMemory pVStack_240;
  VkResult err;
  VkDeviceMemory Memory;
  string msg_2;
  undefined1 local_200 [8];
  string msg_1;
  undefined1 auStack_1d8 [4];
  uint32_t MemoryTypeIndex;
  VkMemoryRequirements MemReqs;
  undefined1 auStack_1a8 [8];
  VkBufferCreateInfo vkBuffCI;
  undefined1 auStack_168 [4];
  uint32_t MaxPrimitiveCount;
  VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo;
  undefined1 local_138 [8];
  string msg;
  VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo;
  VkAccelerationStructureGeometryInstancesDataKHR *vkInstances;
  VkAccelerationStructureGeometryKHR vkGeometry;
  Uint64 AccelStructSize;
  RayTracingProperties *RTProps;
  VulkanPhysicalDevice *PhysicalDevice;
  VulkanLogicalDevice *LogicalDevice;
  TopLevelASDesc *Desc_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  TopLevelASVkImpl *this_local;
  
  TopLevelASBase<Diligent::EngineVkImplTraits>::TopLevelASBase
            (&this->super_TopLevelASBase<Diligent::EngineVkImplTraits>,pRefCounters,pRenderDeviceVk,
             Desc,false);
  (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
  .super_ObjectBase<Diligent::ITopLevelASVk>.super_RefCountedObject<Diligent::ITopLevelASVk>.
  super_ITopLevelASVk.super_ITopLevelAS.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_010d6678;
  this->m_DeviceAddress = 0;
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  VulkanObjectWrapper(&this->m_VulkanTLAS);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  VulkanObjectWrapper(&this->m_VulkanBuffer);
  VulkanUtilities::VulkanMemoryAllocation::VulkanMemoryAllocation(&this->m_MemoryAllocation);
  this->m_MemoryAlignedOffset = 0;
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pRenderDeviceVk);
  this_01 = RenderDeviceVkImpl::GetPhysicalDevice(pRenderDeviceVk);
  pGVar2 = RenderDeviceBase<Diligent::EngineVkImplTraits>::GetAdapterInfo
                     ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)pRenderDeviceVk);
  vkGeometry._88_8_ =
       (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
       .m_Desc.CompactedSize;
  if (vkGeometry._88_8_ == 0) {
    msg.field_2._8_8_ = 0x3b9d13f0;
    BuildASFlagsToVkBuildAccelerationStructureFlags
              ((this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
               .m_Desc.Flags);
    if ((pGVar2->RayTracing).MaxInstancesPerTLAS <
        (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
        .m_Desc.MaxInstanceCount) {
      FormatString<char[21],unsigned_int,char[25],unsigned_int,char[3]>
                ((string *)local_138,(Diligent *)"Max instance count (",
                 (char (*) [21])
                 &(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                  .m_Desc.MaxInstanceCount,(uint *)") exceeds device limit (",
                 (char (*) [25])&(pGVar2->RayTracing).MaxInstancesPerTLAS,(uint *)0xccce78,
                 in_stack_fffffffffffffc58);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"TopLevelASVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
                 ,0x40);
      std::__cxx11::string::~string((string *)local_138);
    }
    vkSizeInfo.pNext = (void *)0x0;
    vkSizeInfo.accelerationStructureSize = 0;
    vkSizeInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    vkSizeInfo._4_4_ = 0;
    vkSizeInfo.updateScratchSize = 0;
    auStack_168 = (undefined1  [4])0x3b9d1404;
    MaxPrimitiveCount = 0;
    vkBuffCI.pQueueFamilyIndices._4_4_ =
         (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
         .m_Desc.MaxInstanceCount;
    VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureBuildSizes
              (this_00,(VkAccelerationStructureBuildGeometryInfoKHR *)((long)&msg.field_2 + 8),
               (uint32_t *)((long)&vkBuffCI.pQueueFamilyIndices + 4),
               (VkAccelerationStructureBuildSizesInfoKHR *)auStack_168);
    vkGeometry._88_8_ = vkSizeInfo.pNext;
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Build =
         vkSizeInfo.updateScratchSize;
    (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).m_ScratchSize.Update =
         vkSizeInfo.accelerationStructureSize;
  }
  vkBuffCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkBuffCI._4_4_ = 0;
  auStack_1a8 = (undefined1  [8])0xc;
  vkBuffCI.pNext = (void *)0x0;
  vkBuffCI.flags = vkGeometry.flags;
  vkBuffCI._20_4_ = vkGeometry._92_4_;
  vkBuffCI.size =
       (long)
       "_ZNSt10_HashtableIiSt4pairIKiPKcESaIS4_ENSt8__detail10_Select1stESt8equal_toIiESt4hashIiENS6_18_Mod_range_hashingENS6_20_Default_ranged_hashENS6_20_Prime_rehash_policyENS6_17_Hashtable_traitsILb0ELb0ELb1EEEED2Ev"
       + 0xbc;
  vkBuffCI.usage = 0;
  vkBuffCI.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vkBuffCI.queueFamilyIndexCount = 0;
  vkBuffCI._44_4_ = 0;
  VulkanUtilities::VulkanLogicalDevice::CreateBuffer
            ((BufferWrapper *)&MemReqs.memoryTypeBits,this_00,(VkBufferCreateInfo *)auStack_1a8,
             (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  operator=(&this->m_VulkanBuffer,
            (VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
            &MemReqs.memoryTypeBits);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2> *)
             &MemReqs.memoryTypeBits);
  pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  VulkanUtilities::VulkanLogicalDevice::GetBufferMemoryRequirements
            ((VkMemoryRequirements *)auStack_1d8,this_00,pVVar4);
  msg_1.field_2._12_4_ =
       VulkanUtilities::VulkanPhysicalDevice::GetMemoryTypeIndex
                 (this_01,(uint32_t)MemReqs.alignment,1);
  bVar1 = IsPowerOfTwo<unsigned_long>(MemReqs.size);
  if (!bVar1) {
    FormatString<char[29]>((string *)local_200,(char (*) [29])"Alignment is not power of 2!");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5b);
    std::__cxx11::string::~string((string *)local_200);
  }
  RenderDeviceVkImpl::AllocateMemory
            ((VulkanMemoryAllocation *)((long)&msg_2.field_2 + 8),pRenderDeviceVk,_auStack_1d8,
             MemReqs.size,msg_1.field_2._12_4_,2);
  rhs = (VulkanMemoryAllocation *)((long)&msg_2.field_2 + 8);
  VulkanUtilities::VulkanMemoryAllocation::operator=(&this->m_MemoryAllocation,rhs);
  VulkanUtilities::VulkanMemoryAllocation::~VulkanMemoryAllocation(rhs);
  bVar1 = VulkanUtilities::VulkanMemoryAllocation::operator_cast_to_bool(&this->m_MemoryAllocation);
  if (!bVar1) {
    LogError<true,char[37],char_const*,char[3]>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x5e,(char (*) [37])"Failed to allocate memory for TLAS \'",
               (char **)&(this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
                         .m_Desc,(char (*) [3])"\'.");
  }
  tVar5 = AlignUp<unsigned_long,unsigned_long>
                    ((this->m_MemoryAllocation).UnalignedOffset,MemReqs.size);
  this->m_MemoryAlignedOffset = tVar5;
  if ((this->m_MemoryAllocation).Size <
      _auStack_1d8 + (this->m_MemoryAlignedOffset - (this->m_MemoryAllocation).UnalignedOffset)) {
    FormatString<char[39]>
              ((string *)&Memory,(char (*) [39])"Size of memory allocation is too small");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,0x61);
    std::__cxx11::string::~string((string *)&Memory);
  }
  pVStack_240 = VulkanUtilities::VulkanMemoryPage::GetVkMemory((this->m_MemoryAllocation).Page);
  pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  local_244 = VulkanUtilities::VulkanLogicalDevice::BindBufferMemory
                        (this_00,pVVar4,pVStack_240,this->m_MemoryAlignedOffset);
  if (local_244 != VK_SUCCESS) {
    local_250 = VulkanUtilities::VkResultToString(local_244);
    LogError<true,char[29],char[17],char_const*>
              (false,"TopLevelASVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/TopLevelASVkImpl.cpp"
               ,100,(char (*) [29])"Failed to bind buffer memory",(char (*) [17])"\nVK Error Code: "
               ,&local_250);
  }
  vkAccelStrCI.size = 0;
  vkAccelStrCI.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  vkAccelStrCI._52_4_ = 0;
  vkAccelStrCI.buffer = (VkBuffer)0x0;
  vkAccelStrCI.offset = 0;
  vkAccelStrCI.createFlags = 0;
  vkAccelStrCI._20_4_ = 0;
  vkAccelStrCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vkAccelStrCI._4_4_ = 0;
  auStack_298 = (undefined1  [8])0x3b9d1401;
  vkAccelStrCI.pNext = (void *)0x0;
  vkAccelStrCI._16_8_ =
       VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                 ((VulkanObjectWrapper *)&this->m_VulkanBuffer);
  vkAccelStrCI.buffer = (VkBuffer)0x0;
  vkAccelStrCI.offset = vkGeometry._88_8_;
  vkAccelStrCI.size = vkAccelStrCI.size & 0xffffffff00000000;
  VulkanUtilities::VulkanLogicalDevice::CreateAccelStruct
            (&local_2b0,this_00,(VkAccelerationStructureCreateInfoKHR *)auStack_298,
             (this->super_TopLevelASBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::ITopLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::TopLevelASDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  operator=(&this->m_VulkanTLAS,&local_2b0);
  VulkanUtilities::
  VulkanObjectWrapper<VkAccelerationStructureKHR_T_*,_(VulkanUtilities::VulkanHandleTypeId)21>::
  ~VulkanObjectWrapper(&local_2b0);
  AS = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkAccelerationStructureKHR_T_
                 ((VulkanObjectWrapper *)&this->m_VulkanTLAS);
  VVar6 = VulkanUtilities::VulkanLogicalDevice::GetAccelerationStructureDeviceAddress(this_00,AS);
  this->m_DeviceAddress = VVar6;
  TopLevelASBase<Diligent::EngineVkImplTraits>::SetState
            (&this->super_TopLevelASBase<Diligent::EngineVkImplTraits>,RESOURCE_STATE_BUILD_AS_READ)
  ;
  return;
}

Assistant:

TopLevelASVkImpl::TopLevelASVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pRenderDeviceVk,
                                   const TopLevelASDesc& Desc) :
    TTopLevelASBase{pRefCounters, pRenderDeviceVk, Desc}
{
    const auto& LogicalDevice   = pRenderDeviceVk->GetLogicalDevice();
    const auto& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    const auto& RTProps         = pRenderDeviceVk->GetAdapterInfo().RayTracing;
    auto        AccelStructSize = m_Desc.CompactedSize;

    if (AccelStructSize == 0)
    {
        VkAccelerationStructureGeometryKHR vkGeometry{};
        vkGeometry.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
        vkGeometry.geometryType = VK_GEOMETRY_TYPE_INSTANCES_KHR;

        VkAccelerationStructureGeometryInstancesDataKHR& vkInstances{vkGeometry.geometry.instances};
        vkInstances.sType           = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_INSTANCES_DATA_KHR;
        vkInstances.arrayOfPointers = VK_FALSE;

        VkAccelerationStructureBuildGeometryInfoKHR vkBuildInfo{};
        vkBuildInfo.sType         = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
        vkBuildInfo.flags         = BuildASFlagsToVkBuildAccelerationStructureFlags(m_Desc.Flags);
        vkBuildInfo.type          = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
        vkBuildInfo.pGeometries   = &vkGeometry;
        vkBuildInfo.geometryCount = 1;

        DEV_CHECK_ERR(m_Desc.MaxInstanceCount <= RTProps.MaxInstancesPerTLAS,
                      "Max instance count (", m_Desc.MaxInstanceCount, ") exceeds device limit (", RTProps.MaxInstancesPerTLAS, ").");

        VkAccelerationStructureBuildSizesInfoKHR vkSizeInfo{};
        vkSizeInfo.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_SIZES_INFO_KHR;

        const uint32_t MaxPrimitiveCount = m_Desc.MaxInstanceCount;
        LogicalDevice.GetAccelerationStructureBuildSizes(vkBuildInfo, &MaxPrimitiveCount, vkSizeInfo);

        AccelStructSize      = vkSizeInfo.accelerationStructureSize;
        m_ScratchSize.Build  = vkSizeInfo.buildScratchSize;
        m_ScratchSize.Update = vkSizeInfo.updateScratchSize;
    }

    VkBufferCreateInfo vkBuffCI{};
    vkBuffCI.sType                 = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
    vkBuffCI.flags                 = 0;
    vkBuffCI.size                  = AccelStructSize;
    vkBuffCI.usage                 = VK_BUFFER_USAGE_ACCELERATION_STRUCTURE_STORAGE_BIT_KHR | VK_BUFFER_USAGE_SHADER_DEVICE_ADDRESS_BIT;
    vkBuffCI.sharingMode           = VK_SHARING_MODE_EXCLUSIVE;
    vkBuffCI.queueFamilyIndexCount = 0;
    vkBuffCI.pQueueFamilyIndices   = nullptr;

    m_VulkanBuffer = LogicalDevice.CreateBuffer(vkBuffCI, m_Desc.Name);

    VkMemoryRequirements MemReqs         = LogicalDevice.GetBufferMemoryRequirements(m_VulkanBuffer);
    uint32_t             MemoryTypeIndex = PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT);

    VERIFY(IsPowerOfTwo(MemReqs.alignment), "Alignment is not power of 2!");
    m_MemoryAllocation = pRenderDeviceVk->AllocateMemory(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, VK_MEMORY_ALLOCATE_DEVICE_ADDRESS_BIT);
    if (!m_MemoryAllocation)
        LOG_ERROR_AND_THROW("Failed to allocate memory for TLAS '", m_Desc.Name, "'.");

    m_MemoryAlignedOffset = AlignUp(VkDeviceSize{m_MemoryAllocation.UnalignedOffset}, MemReqs.alignment);
    VERIFY(m_MemoryAllocation.Size >= MemReqs.size + (m_MemoryAlignedOffset - m_MemoryAllocation.UnalignedOffset), "Size of memory allocation is too small");
    auto Memory = m_MemoryAllocation.Page->GetVkMemory();
    auto err    = LogicalDevice.BindBufferMemory(m_VulkanBuffer, Memory, m_MemoryAlignedOffset);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to bind buffer memory");

    VkAccelerationStructureCreateInfoKHR vkAccelStrCI{};
    vkAccelStrCI.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_CREATE_INFO_KHR;
    vkAccelStrCI.createFlags = 0;
    vkAccelStrCI.buffer      = m_VulkanBuffer;
    vkAccelStrCI.offset      = 0;
    vkAccelStrCI.size        = AccelStructSize;
    vkAccelStrCI.type        = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;

    m_VulkanTLAS = LogicalDevice.CreateAccelStruct(vkAccelStrCI, m_Desc.Name);

    m_DeviceAddress = LogicalDevice.GetAccelerationStructureDeviceAddress(m_VulkanTLAS);

    SetState(RESOURCE_STATE_BUILD_AS_READ);
}